

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

bool __thiscall
command_tester::inside<17ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
          (command_tester *this,array<TypeCommand,_17UL> *command_list1,
          vector<TypeCommand,_std::allocator<TypeCommand>_> *command_list2)

{
  bool bVar1;
  
  bVar1 = std::
          any_of<TypeCommand_const*,command_tester::inside<17ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,17ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_1_>
                    (command_list1->_M_elems,command_list1[1]._M_elems,
                     (anon_class_8_1_8991fb9c_for__M_pred)this);
  if (bVar1) {
    return true;
  }
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<TypeCommand_const*,std::vector<TypeCommand,std::allocator<TypeCommand>>>,command_tester::inside<17ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,17ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_2_>
                    ((__normal_iterator<const_TypeCommand_*,_std::vector<TypeCommand,_std::allocator<TypeCommand>_>_>
                      )(command_list2->super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_TypeCommand_*,_std::vector<TypeCommand,_std::allocator<TypeCommand>_>_>
                      )(command_list2->super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
                     (anon_class_8_1_8991fb9c_for__M_pred)this);
  return bVar1;
}

Assistant:

bool inside(std::array<TypeCommand, inum> const &command_list1, vec2_t const &command_list2 = {}){
        return (std::any_of(command_list1.begin(), command_list1.end(), [&](TypeCommand c)->bool{ return (c == command); })
            or std::any_of(command_list2.begin(), command_list2.end(), [&](TypeCommand c)->bool{ return (c == command); }));
    }